

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O1

void * elem_new(t_symbol *templatesym,t_symbol *fieldsym)

{
  t_object *owner;
  t_pd p_Var1;
  
  owner = (t_object *)pd_new(elem_class);
  p_Var1 = (t_pd)template_getbindsym(templatesym);
  owner[1].te_g.g_pd = p_Var1;
  owner[1].te_g.g_next = (_gobj *)fieldsym;
  gpointer_init((t_gpointer *)&owner[1].te_binbuf);
  gpointer_init((t_gpointer *)&owner[1].te_xpix);
  pointerinlet_new(owner,(t_gpointer *)&owner[1].te_xpix);
  outlet_new(owner,&s_pointer);
  return owner;
}

Assistant:

static void *elem_new(t_symbol *templatesym, t_symbol *fieldsym)
{
    t_elem *x = (t_elem *)pd_new(elem_class);
    x->x_templatesym = template_getbindsym(templatesym);
    x->x_fieldsym = fieldsym;
    gpointer_init(&x->x_gp);
    gpointer_init(&x->x_gparent);
    pointerinlet_new(&x->x_obj, &x->x_gparent);
    outlet_new(&x->x_obj, &s_pointer);
    return (x);
}